

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

drmp3_uint32
drmp3_decode_next_frame_ex(drmp3 *pMP3,drmp3d_sample_t *pPCMFrames,drmp3_bool32 discard)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  drmp3_uint8 *pdVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uVar7;
  size_t sVar8;
  size_t __n;
  long lVar9;
  drmp3dec_frame_info info;
  drmp3dec_frame_info local_44;
  
  uVar3 = 0;
  if ((pMP3->field_0x52d0 & 1) == 0) {
    while( true ) {
      uVar7 = pMP3->dataSize;
      if (uVar7 < 0x4000) {
        uVar6 = pMP3->dataCapacity;
        pdVar4 = pMP3->pData;
        if (uVar6 < 0x4000) {
          pMP3->dataCapacity = 0x4000;
          pdVar4 = (drmp3_uint8 *)realloc(pdVar4,0x4000);
          if (pdVar4 == (drmp3_uint8 *)0x0) {
            return 0;
          }
          pMP3->pData = pdVar4;
          uVar7 = pMP3->dataSize;
          uVar6 = pMP3->dataCapacity;
        }
        sVar5 = (*pMP3->onRead)(pMP3->pUserData,pdVar4 + uVar7,uVar6 - uVar7);
        pMP3->streamCursor = pMP3->streamCursor + sVar5;
        if (sVar5 == 0 && pMP3->dataSize == 0) goto LAB_00107b2e;
        uVar7 = pMP3->dataSize + sVar5;
        pMP3->dataSize = uVar7;
      }
      if (uVar7 >> 0x1f != 0) goto LAB_00107b2e;
      iVar2 = drmp3dec_decode_frame(&pMP3->decoder,pMP3->pData,(int)uVar7,pPCMFrames,&local_44);
      iVar1 = local_44.frame_bytes;
      lVar9 = (long)local_44.frame_bytes;
      if (0 < lVar9) {
        __n = pMP3->dataSize - lVar9;
        memmove(pMP3->pData,pMP3->pData + lVar9,__n);
        pMP3->dataSize = __n;
      }
      if ((iVar2 != 0) || (discard != 0 && 0 < iVar1)) break;
      if (iVar1 == 0) {
        sVar5 = pMP3->dataSize;
        sVar8 = pMP3->dataCapacity;
        pdVar4 = pMP3->pData;
        if (sVar8 == sVar5) {
          pMP3->dataCapacity = sVar8 + 0x4000;
          pdVar4 = (drmp3_uint8 *)realloc(pdVar4,sVar8 + 0x4000);
          if (pdVar4 == (drmp3_uint8 *)0x0) {
            return 0;
          }
          pMP3->pData = pdVar4;
          sVar5 = pMP3->dataSize;
          sVar8 = pMP3->dataCapacity;
        }
        sVar5 = (*pMP3->onRead)(pMP3->pUserData,pdVar4 + sVar5,sVar8 - sVar5);
        pMP3->streamCursor = pMP3->streamCursor + sVar5;
        if (sVar5 == 0) {
LAB_00107b2e:
          pMP3->field_0x52d0 = pMP3->field_0x52d0 | 1;
          return 0;
        }
        pMP3->dataSize = pMP3->dataSize + sVar5;
      }
    }
    uVar3 = drmp3_hdr_frame_samples((pMP3->decoder).header);
    pMP3->pcmFramesConsumedInMP3Frame = 0;
    pMP3->pcmFramesRemainingInMP3Frame = uVar3;
    pMP3->mp3FrameChannels = local_44.channels;
    pMP3->mp3FrameSampleRate = local_44.hz;
    if (local_44.hz != 0) {
      (pMP3->src).config.sampleRateIn = local_44.hz;
    }
  }
  return uVar3;
}

Assistant:

static drmp3_uint32 drmp3_decode_next_frame_ex(drmp3* pMP3, drmp3d_sample_t* pPCMFrames, drmp3_bool32 discard)
{
            drmp3_assert(pMP3 != NULL);
            drmp3_assert(pMP3->onRead != NULL);

    if (pMP3->atEnd) {
        return 0;
    }

    drmp3_uint32 pcmFramesRead = 0;
    do {
        // minimp3 recommends doing data submission in 16K chunks. If we don't have at least 16K bytes available, get more.
        if (pMP3->dataSize < DRMP3_DATA_CHUNK_SIZE) {
            if (pMP3->dataCapacity < DRMP3_DATA_CHUNK_SIZE) {
                pMP3->dataCapacity = DRMP3_DATA_CHUNK_SIZE;
                drmp3_uint8* pNewData = (drmp3_uint8*)drmp3_realloc(pMP3->pData, pMP3->dataCapacity);
                if (pNewData == NULL) {
                    return 0; // Out of memory.
                }

                pMP3->pData = pNewData;
            }

            size_t bytesRead = drmp3__on_read(pMP3, pMP3->pData + pMP3->dataSize, (pMP3->dataCapacity - pMP3->dataSize));
            if (bytesRead == 0) {
                if (pMP3->dataSize == 0) {
                    pMP3->atEnd = DRMP3_TRUE;
                    return 0; // No data.
                }
            }

            pMP3->dataSize += bytesRead;
        }

        if (pMP3->dataSize > INT_MAX) {
            pMP3->atEnd = DRMP3_TRUE;
            return 0; // File too big.
        }

        drmp3dec_frame_info info;
        pcmFramesRead = drmp3dec_decode_frame(&pMP3->decoder, pMP3->pData, (int)pMP3->dataSize, pPCMFrames, &info);    // <-- Safe size_t -> int conversion thanks to the check above.

        // Consume the data.
        size_t leftoverDataSize = (pMP3->dataSize - (size_t)info.frame_bytes);
        if (info.frame_bytes > 0) {
            memmove(pMP3->pData, pMP3->pData + info.frame_bytes, leftoverDataSize);
            pMP3->dataSize = leftoverDataSize;
        }

        // pcmFramesRead will be equal to 0 if decoding failed. If it is zero and info.frame_bytes > 0 then we have successfully
        // decoded the frame. A special case is if we are wanting to discard the frame, in which case we return successfully.
        if (pcmFramesRead > 0 || (info.frame_bytes > 0 && discard)) {
            pcmFramesRead = drmp3_hdr_frame_samples(pMP3->decoder.header);
            pMP3->pcmFramesConsumedInMP3Frame = 0;
            pMP3->pcmFramesRemainingInMP3Frame = pcmFramesRead;
            pMP3->mp3FrameChannels = info.channels;
            pMP3->mp3FrameSampleRate = info.hz;
            drmp3_src_set_input_sample_rate(&pMP3->src, pMP3->mp3FrameSampleRate);
            break;
        } else if (info.frame_bytes == 0) {
            // Need more data. minimp3 recommends doing data submission in 16K chunks.
            if (pMP3->dataCapacity == pMP3->dataSize) {
                // No room. Expand.
                pMP3->dataCapacity += DRMP3_DATA_CHUNK_SIZE;
                drmp3_uint8* pNewData = (drmp3_uint8*)drmp3_realloc(pMP3->pData, pMP3->dataCapacity);
                if (pNewData == NULL) {
                    return 0; // Out of memory.
                }

                pMP3->pData = pNewData;
            }

            // Fill in a chunk.
            size_t bytesRead = drmp3__on_read(pMP3, pMP3->pData + pMP3->dataSize, (pMP3->dataCapacity - pMP3->dataSize));
            if (bytesRead == 0) {
                pMP3->atEnd = DRMP3_TRUE;
                return 0; // Error reading more data.
            }

            pMP3->dataSize += bytesRead;
        }
    } while (DRMP3_TRUE);

    return pcmFramesRead;
}